

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

void __thiscall tetgenbehavior::usage(tetgenbehavior *this)

{
  undefined4 *puVar1;
  tetgenbehavior *this_00;
  
  puts("TetGen");
  printf("A Quality Tetrahedral Mesh Generator and 3D Delaunay ");
  puts("Triangulator");
  puts("Version 1.5");
  puts("May 31, 2014");
  putchar(10);
  puts("Copyright (C) 2002 - 2014");
  putchar(10);
  puts("What Can TetGen Do?");
  putchar(10);
  puts("  TetGen generates Delaunay tetrahedralizations, constrained");
  puts("  Delaunay tetrahedralizations, and quality tetrahedral meshes.");
  putchar(10);
  puts("Command Line Syntax:");
  putchar(10);
  printf("  Below is the basic command line syntax of TetGen with a list of ");
  puts("short");
  puts("  descriptions. Underscores indicate that numbers may optionally");
  printf("  follow certain switches.  Do not leave any space between a ");
  puts("switch");
  puts("  and its numeric parameter.  \'input_file\' contains input data");
  printf("  depending on the switches you supplied which may be a ");
  puts("  piecewise");
  puts("  linear complex or a list of nodes.  File formats and detailed");
  printf("  description of command line switches are found in user\'s ");
  puts("manual.");
  this_00 = (tetgenbehavior *)0xa;
  putchar(10);
  syntax(this_00);
  putchar(10);
  puts("Examples of How to Use TetGen:");
  putchar(10);
  printf("  \'tetgen object\' reads vertices from object.node, and writes ");
  printf("their\n  Delaunay tetrahedralization to object.1.node, ");
  printf("object.1.ele\n  (tetrahedra), and object.1.face");
  puts(" (convex hull faces).");
  putchar(10);
  printf("  \'tetgen -p object\' reads a PLC from object.poly or object.");
  printf("smesh (and\n  possibly object.node) and writes its constrained ");
  printf("Delaunay\n  tetrahedralization to object.1.node, object.1.ele, ");
  puts("object.1.face,");
  puts("  (boundary faces) and object.1.edge (boundary edges).");
  putchar(10);
  puts("  \'tetgen -pq1.414a.1 object\' reads a PLC from object.poly or");
  printf("  object.smesh (and possibly object.node), generates a mesh ");
  printf("whose\n  tetrahedra have radius-edge ratio smaller than 1.414 and ");
  printf("have volume\n  of 0.1 or less, and writes the mesh to ");
  puts("object.1.node, object.1.ele,\n  object.1.face, and object.1.edge");
  putchar(10);
  puts("Please send bugs/comments to Hang Si <si@wias-berlin.de>");
  puVar1 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar1 = 0;
  __cxa_throw(puVar1,&int::typeinfo,0);
}

Assistant:

void tetgenbehavior::usage()
{
  printf("TetGen\n");
  printf("A Quality Tetrahedral Mesh Generator and 3D Delaunay ");
  printf("Triangulator\n");
  printf("Version 1.5\n");
  printf("May 31, 2014\n");
  printf("\n");
  printf("Copyright (C) 2002 - 2014\n");
  printf("\n");
  printf("What Can TetGen Do?\n");
  printf("\n");
  printf("  TetGen generates Delaunay tetrahedralizations, constrained\n");
  printf("  Delaunay tetrahedralizations, and quality tetrahedral meshes.\n");
  printf("\n");
  printf("Command Line Syntax:\n");
  printf("\n");
  printf("  Below is the basic command line syntax of TetGen with a list of ");
  printf("short\n");
  printf("  descriptions. Underscores indicate that numbers may optionally\n");
  printf("  follow certain switches.  Do not leave any space between a ");
  printf("switch\n");
  printf("  and its numeric parameter.  \'input_file\' contains input data\n");
  printf("  depending on the switches you supplied which may be a ");
  printf("  piecewise\n");
  printf("  linear complex or a list of nodes.  File formats and detailed\n");
  printf("  description of command line switches are found in user's ");
  printf("manual.\n");
  printf("\n");
  syntax();
  printf("\n");
  printf("Examples of How to Use TetGen:\n");
  printf("\n");
  printf("  \'tetgen object\' reads vertices from object.node, and writes ");
  printf("their\n  Delaunay tetrahedralization to object.1.node, ");
  printf("object.1.ele\n  (tetrahedra), and object.1.face");
  printf(" (convex hull faces).\n");
  printf("\n");
  printf("  \'tetgen -p object\' reads a PLC from object.poly or object.");
  printf("smesh (and\n  possibly object.node) and writes its constrained ");
  printf("Delaunay\n  tetrahedralization to object.1.node, object.1.ele, ");
  printf("object.1.face,\n");
  printf("  (boundary faces) and object.1.edge (boundary edges).\n");
  printf("\n");
  printf("  \'tetgen -pq1.414a.1 object\' reads a PLC from object.poly or\n");
  printf("  object.smesh (and possibly object.node), generates a mesh ");
  printf("whose\n  tetrahedra have radius-edge ratio smaller than 1.414 and ");
  printf("have volume\n  of 0.1 or less, and writes the mesh to ");
  printf("object.1.node, object.1.ele,\n  object.1.face, and object.1.edge\n");
  printf("\n");
  printf("Please send bugs/comments to Hang Si <si@wias-berlin.de>\n");
  terminatetetgen(NULL, 0);
}